

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O2

string * __thiscall
glcts::TestCaseBase::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseBase *this,GLuint shader_id)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLint length;
  vector<char,_std::allocator<char>_> result_vec;
  allocator_type local_45;
  int local_44;
  _Vector_base<char,_std::allocator<char>_> local_40;
  long lVar2;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  local_44 = 0;
  (**(code **)(lVar2 + 0xa70))(shader_id,0x8b88,&local_44);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_40,(long)(local_44 + 1),&local_45);
  (**(code **)(lVar2 + 0xa68))
            (shader_id,local_44 + 1,0,local_40._M_impl.super__Vector_impl_data._M_start);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"Could not retrieve shader source!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x332);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_40._M_impl.super__Vector_impl_data._M_start,
             &local_45);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseBase::getShaderSource(glw::GLuint shader_id)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint length = 0;

	gl.getShaderiv(shader_id, GL_SHADER_SOURCE_LENGTH, &length);

	std::vector<char> result_vec(length + 1);

	gl.getShaderSource(shader_id, length + 1, NULL, &result_vec[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve shader source!");

	return std::string(&result_vec[0]);
}